

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Gla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pAig;
  char *pcVar3;
  bool bVar4;
  Gia_Obj_t *local_110;
  Gia_Man_t *pOne;
  Vec_Int_t *vStatuses;
  Vec_Ptr_t *vSeqModelVec;
  int Status;
  int o;
  Gia_Obj_t *pObj;
  char *pLogFileName;
  int fNewAlgo;
  int c;
  Abs_Par_t *pPars;
  Abs_Par_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _fNewAlgo = (Abs_Par_t *)&pPars;
  pLogFileName._0_4_ = 1;
  pObj = (Gia_Obj_t *)0x0;
  Pars._128_8_ = argv;
  Abs_ParSetDefaults(_fNewAlgo);
  Extra_UtilGetoptReset();
LAB_002c6a6c:
  do {
    pLogFileName._4_4_ =
         Extra_UtilGetopt(argc,(char **)Pars._128_8_,"FSCMDETRQPBALtfardmnscbpquwvh");
    if (pLogFileName._4_4_ == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"There is no AIG.\n");
        return 0;
      }
      if (_fNewAlgo->nFramesMax < 0) {
        Abc_Print(1,"The number of starting frames should be a positive integer.\n");
        return 0;
      }
      if ((_fNewAlgo->nFramesMax != 0) && (_fNewAlgo->nFramesMax < _fNewAlgo->nFramesStart)) {
        Abc_Print(1,"The starting frame is larger than the max number of frames.\n");
        return 0;
      }
      iVar1 = Gia_ManPoNum(pAbc->pGia);
      if (iVar1 == 1) {
        if ((uint)pLogFileName == 0) {
          iVar1 = Gia_ManPerformGlaOld(pAbc->pGia,_fNewAlgo,0);
          pAbc->Status = iVar1;
        }
        else {
          iVar1 = Gia_ManPerformGla(pAbc->pGia,_fNewAlgo);
          pAbc->Status = iVar1;
        }
        pAbc->nFrames = _fNewAlgo->iFrame;
        Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
        if (pObj != (Gia_Obj_t *)0x0) {
          Abc_NtkWriteLogFile((char *)pObj,pAbc->pCex,pAbc->Status,pAbc->nFrames,"&gla");
        }
      }
      else {
        iVar1 = Gia_ManPoNum(pAbc->pGia);
        vStatuses = (Vec_Int_t *)Vec_PtrStart(iVar1);
        iVar1 = Gia_ManPoNum(pAbc->pGia);
        pOne = (Gia_Man_t *)Vec_IntAlloc(iVar1);
        vSeqModelVec._4_4_ = 0;
        while( true ) {
          iVar1 = vSeqModelVec._4_4_;
          iVar2 = Gia_ManPoNum(pAbc->pGia);
          bVar4 = false;
          if (iVar1 < iVar2) {
            _Status = Gia_ManCo(pAbc->pGia,vSeqModelVec._4_4_);
            bVar4 = _Status != (Gia_Obj_t *)0x0;
          }
          if (!bVar4) break;
          pAig = Gia_ManDupDfsOnePo(pAbc->pGia,vSeqModelVec._4_4_);
          if ((uint)pLogFileName == 0) {
            vSeqModelVec._0_4_ = Gia_ManPerformGlaOld(pAig,_fNewAlgo,0);
          }
          else {
            vSeqModelVec._0_4_ = Gia_ManPerformGla(pAig,_fNewAlgo);
          }
          Vec_IntPush((Vec_Int_t *)pOne,(int)vSeqModelVec);
          if (pObj != (Gia_Obj_t *)0x0) {
            Abc_NtkWriteLogFile((char *)pObj,pAig->pCexSeq,(int)vSeqModelVec,_fNewAlgo->iFrame,
                                "&gla");
          }
          if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
            Vec_PtrWriteEntry((Vec_Ptr_t *)vStatuses,vSeqModelVec._4_4_,pAig->pCexSeq);
          }
          pAig->pCexSeq = (Abc_Cex_t *)0x0;
          Gia_ManStop(pAig);
          vSeqModelVec._4_4_ = vSeqModelVec._4_4_ + 1;
        }
        iVar1 = Vec_IntSize((Vec_Int_t *)pOne);
        iVar2 = Gia_ManPoNum(pAbc->pGia);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_IntSize(vStatuses) == Gia_ManPoNum(pAbc->pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                        ,0xb903,"int Abc_CommandAbc9Gla(Abc_Frame_t *, int, char **)");
        }
        Abc_FrameReplaceCexVec(pAbc,(Vec_Ptr_t **)&vStatuses);
        Abc_FrameReplacePoStatuses(pAbc,(Vec_Int_t **)&pOne);
        pAbc->nFrames = -1;
      }
      return 0;
    }
    switch(pLogFileName._4_4_) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by a file name.\n");
        goto LAB_002c756d;
      }
      _fNewAlgo->pFileVabs = *(char **)(Pars._128_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002c6a6c;
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nFramesNoChangeLim = iVar1;
      iVar1 = _fNewAlgo->nFramesNoChangeLim;
      break;
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nConfLimit = iVar1;
      iVar1 = _fNewAlgo->nConfLimit;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nLearnedDelta = iVar1;
      iVar1 = _fNewAlgo->nLearnedDelta;
      break;
    case 0x45:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nLearnedPerce = iVar1;
      iVar1 = _fNewAlgo->nLearnedPerce;
      break;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nFramesMax = iVar1;
      iVar1 = _fNewAlgo->nFramesMax;
      break;
    default:
      goto LAB_002c756d;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
        goto LAB_002c756d;
      }
      pObj = *(Gia_Obj_t **)(Pars._128_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002c6a6c;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nLearnedStart = iVar1;
      iVar1 = _fNewAlgo->nLearnedStart;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nRatioMax = iVar1;
      iVar1 = _fNewAlgo->nRatioMax;
      break;
    case 0x51:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-Q\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nRatioMin2 = iVar1;
      iVar1 = _fNewAlgo->nRatioMin2;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nRatioMin = iVar1;
      iVar1 = _fNewAlgo->nRatioMin;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nFramesStart = iVar1;
      iVar1 = _fNewAlgo->nFramesStart;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002c756d;
      }
      iVar1 = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      _fNewAlgo->nTimeOut = iVar1;
      iVar1 = _fNewAlgo->nTimeOut;
      break;
    case 0x61:
      _fNewAlgo->fAddLayer = _fNewAlgo->fAddLayer ^ 1;
      goto LAB_002c6a6c;
    case 0x62:
      _fNewAlgo->fSkipHash = _fNewAlgo->fSkipHash ^ 1;
      goto LAB_002c6a6c;
    case 99:
      _fNewAlgo->fUseSimple = _fNewAlgo->fUseSimple ^ 1;
      goto LAB_002c6a6c;
    case 100:
      _fNewAlgo->fDumpVabs = _fNewAlgo->fDumpVabs ^ 1;
      goto LAB_002c6a6c;
    case 0x66:
      _fNewAlgo->fPropFanout = _fNewAlgo->fPropFanout ^ 1;
      goto LAB_002c6a6c;
    case 0x68:
      goto LAB_002c756d;
    case 0x6d:
      _fNewAlgo->fDumpMabs = _fNewAlgo->fDumpMabs ^ 1;
      goto LAB_002c6a6c;
    case 0x6e:
      pLogFileName._0_4_ = (uint)pLogFileName ^ 1;
      goto LAB_002c6a6c;
    case 0x70:
      _fNewAlgo->fUseFullProof = _fNewAlgo->fUseFullProof ^ 1;
      goto LAB_002c6a6c;
    case 0x71:
      _fNewAlgo->fCallProver = _fNewAlgo->fCallProver ^ 1;
      goto LAB_002c6a6c;
    case 0x72:
      _fNewAlgo->fNewRefine = _fNewAlgo->fNewRefine ^ 1;
      goto LAB_002c6a6c;
    case 0x73:
      _fNewAlgo->fUseSkip = _fNewAlgo->fUseSkip ^ 1;
      goto LAB_002c6a6c;
    case 0x74:
      _fNewAlgo->fUseTermVars = _fNewAlgo->fUseTermVars ^ 1;
      goto LAB_002c6a6c;
    case 0x75:
      _fNewAlgo->fSimpProver = _fNewAlgo->fSimpProver ^ 1;
      goto LAB_002c6a6c;
    case 0x76:
      _fNewAlgo->fVerbose = _fNewAlgo->fVerbose ^ 1;
      goto LAB_002c6a6c;
    case 0x77:
      _fNewAlgo->fVeryVerbose = _fNewAlgo->fVeryVerbose ^ 1;
      goto LAB_002c6a6c;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002c756d:
      Abc_Print(-2,"usage: &gla [-FSCMDETRQPB num] [-AL file] [-fardmnscbpquwvh]\n");
      Abc_Print(-2,"\t          fixed-time-frame gate-level proof- and cex-based abstraction\n");
      Abc_Print(-2,"\t-F num  : the max number of timeframes to unroll [default = %d]\n",
                (ulong)(uint)_fNewAlgo->nFramesMax);
      Abc_Print(-2,"\t-S num  : the starting time frame (0=unused) [default = %d]\n",
                (ulong)(uint)_fNewAlgo->nFramesStart);
      Abc_Print(-2,"\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n",
                (ulong)(uint)_fNewAlgo->nConfLimit);
      Abc_Print(-2,
                "\t-M num  : the max number of learned clauses to keep (0=unused) [default = %d]\n",
                (ulong)(uint)_fNewAlgo->nLearnedStart);
      Abc_Print(-2,"\t-D num  : delta value for learned clause removal [default = %d]\n",
                (ulong)(uint)_fNewAlgo->nLearnedDelta);
      Abc_Print(-2,"\t-E num  : ratio percentage for learned clause removal [default = %d]\n",
                (ulong)(uint)_fNewAlgo->nLearnedPerce);
      Abc_Print(-2,"\t-T num  : an approximate timeout, in seconds [default = %d]\n",
                (ulong)(uint)_fNewAlgo->nTimeOut);
      Abc_Print(-2,
                "\t-R num  : stop when abstraction size exceeds num %% (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)_fNewAlgo->nRatioMin);
      Abc_Print(-2,
                "\t-Q num  : stop when abstraction size exceeds num %% during refinement (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)_fNewAlgo->nRatioMin2);
      Abc_Print(-2,
                "\t-P num  : maximum percentage of added objects before a restart (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)_fNewAlgo->nRatioMax);
      Abc_Print(-2,
                "\t-B num  : the number of stable frames to call prover or dump abstraction [default = %d]\n"
                ,(ulong)(uint)_fNewAlgo->nFramesNoChangeLim);
      Abc_Print(-2,
                "\t-A file : file name for dumping abstrated model (&gla -d) or abstraction map (&gla -m)\n"
               );
      if (pObj == (Gia_Obj_t *)0x0) {
        local_110 = (Gia_Obj_t *)0xc61ab5;
      }
      else {
        local_110 = pObj;
      }
      Abc_Print(-2,"\t-L file : the log file name [default = %s]\n",local_110);
      pcVar3 = "no";
      if (_fNewAlgo->fPropFanout != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-f      : toggle propagating fanout implications [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (_fNewAlgo->fAddLayer != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-a      : toggle refinement by adding one layers of gates [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (_fNewAlgo->fNewRefine != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r      : toggle using improved refinement heuristics [default = %s]\n",pcVar3
               );
      pcVar3 = "no";
      if (_fNewAlgo->fDumpVabs != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d      : toggle dumping abstracted model into a file [default = %s]\n",pcVar3
               );
      pcVar3 = "no";
      if (_fNewAlgo->fDumpMabs != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-m      : toggle dumping abstraction map into a file [default = %s]\n",pcVar3)
      ;
      pcVar3 = "no";
      if ((uint)pLogFileName != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-n      : toggle using new algorithms [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (_fNewAlgo->fUseSkip != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s      : toggle skipping previously proved timeframes [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (_fNewAlgo->fUseSimple != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c      : toggle using naive (2-input AND node) CNF encoding [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (_fNewAlgo->fSkipHash != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-b      : toggle CNF construction without hashing [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (_fNewAlgo->fUseFullProof != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-p      : toggle using full-proof for UNSAT cores [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (_fNewAlgo->fCallProver != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-q      : toggle calling the prover [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (_fNewAlgo->fSimpProver != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,
                "\t-u      : toggle enabling simplifation before calling the prover [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (_fNewAlgo->fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (_fNewAlgo->fVeryVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w      : toggle printing more verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Gla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abs_Par_t Pars, * pPars = &Pars;
    int c, fNewAlgo = 1;
    char * pLogFileName = NULL;
    Abs_ParSetDefaults( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FSCMDETRQPBALtfardmnscbpquwvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesStart < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedStart < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedDelta < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedPerce < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMin < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMin2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMin2 < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMax < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesNoChangeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesNoChangeLim < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pFileVabs = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 't':
            pPars->fUseTermVars ^= 1;
            break;
        case 'f':
            pPars->fPropFanout ^= 1;
            break;
        case 'a':
            pPars->fAddLayer ^= 1;
            break;
        case 'r':
            pPars->fNewRefine ^= 1;
            break;
        case 'd':
            pPars->fDumpVabs ^= 1;
            break;
        case 'm':
            pPars->fDumpMabs ^= 1;
            break;
        case 'n':
            fNewAlgo ^= 1;
            break;
        case 's':
            pPars->fUseSkip ^= 1;
            break;
        case 'c':
            pPars->fUseSimple ^= 1;
            break;
        case 'b':
            pPars->fSkipHash ^= 1;
            break;
        case 'p':
            pPars->fUseFullProof ^= 1;
            break;
        case 'q':
            pPars->fCallProver ^= 1;
            break;
        case 'u':
            pPars->fSimpProver ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no AIG.\n" );
        return 0;
    }
/*
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
*/
    if ( pPars->nFramesMax < 0 )
    {
        Abc_Print( 1, "The number of starting frames should be a positive integer.\n" );
        return 0;
    }
    if ( pPars->nFramesMax && pPars->nFramesStart > pPars->nFramesMax )
    {
        Abc_Print( 1, "The starting frame is larger than the max number of frames.\n" );
        return 0;
    }
    if ( Gia_ManPoNum(pAbc->pGia) == 1 )
    {
        if ( fNewAlgo )
            pAbc->Status = Gia_ManPerformGla( pAbc->pGia, pPars );
        else
            pAbc->Status  = Gia_ManPerformGlaOld( pAbc->pGia, pPars, 0 );
        pAbc->nFrames = pPars->iFrame;
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
        if ( pLogFileName )
            Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&gla" );
    }
    else // iterate over outputs
    {
        Gia_Obj_t * pObj; int o, Status;
        Vec_Ptr_t * vSeqModelVec = Vec_PtrStart( Gia_ManPoNum(pAbc->pGia) );
        Vec_Int_t * vStatuses = Vec_IntAlloc( Gia_ManPoNum(pAbc->pGia) );
        Gia_ManForEachPo( pAbc->pGia, pObj, o )
        {
            Gia_Man_t * pOne = Gia_ManDupDfsOnePo( pAbc->pGia, o );
            if ( fNewAlgo )
                Status = Gia_ManPerformGla( pOne, pPars );
            else
                Status = Gia_ManPerformGlaOld( pOne, pPars, 0 );
            Vec_IntPush( vStatuses, Status );
            if ( pLogFileName )
                Abc_NtkWriteLogFile( pLogFileName, pOne->pCexSeq, Status, pPars->iFrame, "&gla" );
            if ( pOne->pCexSeq )
                Vec_PtrWriteEntry( vSeqModelVec, o, pOne->pCexSeq );
            pOne->pCexSeq = NULL;
            Gia_ManStop( pOne );
        }
        assert( Vec_IntSize(vStatuses) == Gia_ManPoNum(pAbc->pGia) );
        Abc_FrameReplaceCexVec( pAbc, &vSeqModelVec );
        Abc_FrameReplacePoStatuses( pAbc, &vStatuses );
        pAbc->nFrames = -1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &gla [-FSCMDETRQPB num] [-AL file] [-fardmnscbpquwvh]\n" );
    Abc_Print( -2, "\t          fixed-time-frame gate-level proof- and cex-based abstraction\n" );
    Abc_Print( -2, "\t-F num  : the max number of timeframes to unroll [default = %d]\n", pPars->nFramesMax );
    Abc_Print( -2, "\t-S num  : the starting time frame (0=unused) [default = %d]\n", pPars->nFramesStart );
    Abc_Print( -2, "\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n", pPars->nConfLimit );
    Abc_Print( -2, "\t-M num  : the max number of learned clauses to keep (0=unused) [default = %d]\n", pPars->nLearnedStart );
    Abc_Print( -2, "\t-D num  : delta value for learned clause removal [default = %d]\n", pPars->nLearnedDelta );
    Abc_Print( -2, "\t-E num  : ratio percentage for learned clause removal [default = %d]\n", pPars->nLearnedPerce );
    Abc_Print( -2, "\t-T num  : an approximate timeout, in seconds [default = %d]\n", pPars->nTimeOut );
    Abc_Print( -2, "\t-R num  : stop when abstraction size exceeds num %% (0<=num<=100) [default = %d]\n", pPars->nRatioMin );
    Abc_Print( -2, "\t-Q num  : stop when abstraction size exceeds num %% during refinement (0<=num<=100) [default = %d]\n", pPars->nRatioMin2 );
    Abc_Print( -2, "\t-P num  : maximum percentage of added objects before a restart (0<=num<=100) [default = %d]\n", pPars->nRatioMax );
    Abc_Print( -2, "\t-B num  : the number of stable frames to call prover or dump abstraction [default = %d]\n", pPars->nFramesNoChangeLim );
    Abc_Print( -2, "\t-A file : file name for dumping abstrated model (&gla -d) or abstraction map (&gla -m)\n" );
    Abc_Print( -2, "\t-L file : the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-f      : toggle propagating fanout implications [default = %s]\n", pPars->fPropFanout? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggle refinement by adding one layers of gates [default = %s]\n", pPars->fAddLayer? "yes": "no" );
    Abc_Print( -2, "\t-r      : toggle using improved refinement heuristics [default = %s]\n", pPars->fNewRefine? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggle dumping abstracted model into a file [default = %s]\n", pPars->fDumpVabs? "yes": "no" );
    Abc_Print( -2, "\t-m      : toggle dumping abstraction map into a file [default = %s]\n", pPars->fDumpMabs? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggle using new algorithms [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle skipping previously proved timeframes [default = %s]\n", pPars->fUseSkip? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggle using naive (2-input AND node) CNF encoding [default = %s]\n", pPars->fUseSimple? "yes": "no" );
    Abc_Print( -2, "\t-b      : toggle CNF construction without hashing [default = %s]\n", pPars->fSkipHash? "yes": "no" );
    Abc_Print( -2, "\t-p      : toggle using full-proof for UNSAT cores [default = %s]\n", pPars->fUseFullProof? "yes": "no" );
    Abc_Print( -2, "\t-q      : toggle calling the prover [default = %s]\n", pPars->fCallProver? "yes": "no" );
    Abc_Print( -2, "\t-u      : toggle enabling simplifation before calling the prover [default = %s]\n", pPars->fSimpProver? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w      : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}